

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O3

bool __thiscall ON_Xform::IsIdentity(ON_Xform *this,double zero_tolerance)

{
  bool bVar1;
  long lVar2;
  
  bVar1 = false;
  if ((0.0 <= zero_tolerance) && (zero_tolerance < 1.23432101234321e+308)) {
    lVar2 = 0;
    do {
      if ((((zero_tolerance < ABS(1.0 - *(double *)((long)this->m_xform[0] + lVar2))) ||
           (zero_tolerance < ABS(*(double *)((long)this->m_xform[0] + lVar2 + 8)))) ||
          (zero_tolerance < ABS(*(double *)((long)this->m_xform[0] + lVar2 + 0x10)))) ||
         ((zero_tolerance < ABS(*(double *)((long)this->m_xform[0] + lVar2 + 0x18)) ||
          (zero_tolerance < ABS(*(double *)((long)this->m_xform[1] + lVar2)))))) {
        return false;
      }
      lVar2 = lVar2 + 0x28;
    } while ((int)lVar2 != 0x78);
    bVar1 = ABS(1.0 - this->m_xform[3][3]) <= zero_tolerance;
  }
  return bVar1;
}

Assistant:

bool ON_Xform::IsIdentity( double zero_tolerance ) const
{
  // The code below will return false if m_xform[][] contains
  // a nan value.

  if (!(zero_tolerance >= 0.0 && zero_tolerance < ON_UNSET_POSITIVE_VALUE))
    return false;

  const double* v = &m_xform[0][0];
  for ( int i = 0; i < 3; i++ )
  {
    if ( !(fabs(1.0 - *v++) <= zero_tolerance) )
      return false;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return false;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return false;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return false;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return false;
  }
  if ( !(fabs( 1.0 - *v ) <= zero_tolerance) )
    return false;

  return true;
}